

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O3

void PaUtil_SetInterleavedOutputChannels
               (PaUtilBufferProcessor *bp,uint firstChannel,void *data,uint channelCount)

{
  uint uVar1;
  uint channel;
  PaUtilChannelDescriptor *pPVar2;
  ulong uVar3;
  uint uVar4;
  
  if ((channelCount != 0) || (channelCount = bp->outputChannelCount, channelCount != 0)) {
    uVar1 = bp->bytesPerHostOutputSample;
    pPVar2 = bp->hostOutputChannels[0];
    uVar3 = 0;
    do {
      uVar4 = firstChannel + (int)uVar3;
      pPVar2[uVar4].data = data;
      pPVar2 = bp->hostOutputChannels[0];
      pPVar2[uVar4].stride = channelCount;
      data = (void *)((long)data + (ulong)uVar1);
      uVar3 = uVar3 + 1;
    } while (channelCount != uVar3);
  }
  return;
}

Assistant:

void PaUtil_SetInterleavedOutputChannels( PaUtilBufferProcessor* bp,
        unsigned int firstChannel, void *data, unsigned int channelCount )
{
    unsigned int i;
    unsigned int channel = firstChannel;
    unsigned char *p = (unsigned char*)data;

    if( channelCount == 0 )
        channelCount = bp->outputChannelCount;

    assert( firstChannel < bp->outputChannelCount );
    assert( firstChannel + channelCount <= bp->outputChannelCount );
    assert( bp->hostOutputIsInterleaved );
    
    for( i=0; i< channelCount; ++i )
    {
        PaUtil_SetOutputChannel( bp, channel + i, p, channelCount );
        p += bp->bytesPerHostOutputSample;
    }
}